

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_math.h
# Opt level: O2

uint crnlib::math::bitmask_size(uint mask)

{
  uint size;
  
  size = 0;
  for (; mask != 0; mask = mask - 1 & mask) {
    size = size + 1;
  }
  return size;
}

Assistant:

inline uint bitmask_size(uint mask)
        {
            uint size = 0;
            while (mask)
            {
                mask &= (mask - 1U);
                size++;
            }
            return size;
        }